

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O3

void Handlers::StatSkill_Take(Character *character,PacketReader *reader)

{
  short spell;
  NPC_Learn_Skill *pNVar1;
  bool bVar2;
  unsigned_short spell_00;
  int iVar3;
  NPC_Data *pNVar4;
  long lVar5;
  pointer puVar6;
  PacketBuilder reply;
  PacketBuilder PStack_58;
  
  PacketReader::GetInt(reader);
  spell_00 = PacketReader::GetShort(reader);
  bVar2 = Character::HasSpell(character,spell_00);
  if (bVar2) {
    return;
  }
  if (character->npc_type != Skills) {
    return;
  }
  pNVar4 = NPC::Data(character->npc);
  puVar6 = (pNVar4->skill_learn).
           super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (puVar6 == (pNVar4->skill_learn).
                  super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pNVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
             super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl;
    if ((uint)pNVar1->id == (int)(short)spell_00) break;
    puVar6 = puVar6 + 1;
  }
  if (pNVar1->levelreq <= character->level) {
    iVar3 = Character::HasItem(character,1,false);
    pNVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
             super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl;
    if (((((pNVar1->cost <= iVar3) && ((int)pNVar1->strreq <= *character->display_str)) &&
         ((int)pNVar1->intreq <= *character->display_intl)) &&
        (((int)pNVar1->wisreq <= *character->display_wis &&
         ((int)pNVar1->agireq <= *character->display_agi)))) &&
       (((int)pNVar1->conreq <= *character->display_con &&
        ((int)pNVar1->chareq <= *character->display_cha)))) {
      if ((pNVar1->classreq == '\0') || (character->clas == pNVar1->classreq)) {
        lVar5 = 0;
        do {
          spell = *(short *)((long)(pNVar1->skillreq)._M_elems + lVar5);
          if ((spell != 0) && (bVar2 = Character::HasSpell(character,spell), !bVar2)) {
            PacketBuilder::PacketBuilder(&PStack_58,PACKET_STATSKILL,PACKET_REPLY,4);
            PacketBuilder::AddShort(&PStack_58,2);
            PacketBuilder::AddShort(&PStack_58,(uint)character->clas);
            Character::Send(character,&PStack_58);
            goto LAB_00166198;
          }
          lVar5 = lVar5 + 2;
        } while (lVar5 != 8);
        Character::DelItem(character,1,
                           ((puVar6->_M_t).
                            super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                            .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->cost);
        Character::AddSpell(character,spell_00);
        PacketBuilder::PacketBuilder(&PStack_58,PACKET_STATSKILL,PACKET_TAKE,6);
        PacketBuilder::AddShort(&PStack_58,(int)(short)spell_00);
        iVar3 = Character::HasItem(character,1,false);
        PacketBuilder::AddInt(&PStack_58,iVar3);
        Character::Send(character,&PStack_58);
      }
      else {
        PacketBuilder::PacketBuilder(&PStack_58,PACKET_STATSKILL,PACKET_REPLY,4);
        PacketBuilder::AddShort(&PStack_58,2);
        PacketBuilder::AddShort(&PStack_58,(uint)character->clas);
        Character::Send(character,&PStack_58);
      }
      goto LAB_00166198;
    }
  }
  PacketBuilder::PacketBuilder(&PStack_58,PACKET_STATSKILL,PACKET_REPLY,4);
  PacketBuilder::AddShort(&PStack_58,2);
  PacketBuilder::AddShort(&PStack_58,(uint)character->clas);
  Character::Send(character,&PStack_58);
LAB_00166198:
  PacketBuilder::~PacketBuilder(&PStack_58);
  return;
}

Assistant:

void StatSkill_Take(Character *character, PacketReader &reader)
{
	/*int shopid = */reader.GetInt();
	short spell_id = reader.GetShort();

	if (character->HasSpell(spell_id))
		return;

	if (character->npc_type == ENF::Skills)
	{
		UTIL_FOREACH_CREF(character->npc->Data().skill_learn, spell)
		{
			if (spell->id == spell_id)
			{
				if (character->level < spell->levelreq || character->HasItem(1) < spell->cost
				 || character->display_str < spell->strreq || character->display_intl < spell->intreq
				 || character->display_wis < spell->wisreq || character->display_agi < spell->agireq
				 || character->display_con < spell->conreq || character->display_cha < spell->chareq)
				{
					// No correct reply for these
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				if (spell->classreq != 0 && character->clas != spell->classreq)
				{
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				UTIL_FOREACH(spell->skillreq, req)
				{
					if (req != 0 && !character->HasSpell(req))
					{
						// No correct reply for this
						PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
						reply.AddShort(SKILLMASTER_WRONG_CLASS);
						reply.AddShort(character->clas);
						character->Send(reply);
						return;
					}
				}

				character->DelItem(1, spell->cost);
				character->AddSpell(spell_id);

				PacketBuilder reply(PACKET_STATSKILL, PACKET_TAKE, 6);
				reply.AddShort(spell_id);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				break;
			}
		}
	}
}